

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O0

int hash_file(gost_hash_ctx *ctx,char *filename,char *sum,int mode)

{
  int __fd;
  int iVar1;
  int in_ECX;
  char *in_RSI;
  int fd;
  char *in_stack_0003ffe8;
  int in_stack_0003fff4;
  gost_hash_ctx *in_stack_0003fff8;
  undefined4 local_4;
  
  __fd = open(in_RSI,in_ECX);
  if (__fd < 0) {
    perror(in_RSI);
    local_4 = 0;
  }
  else {
    iVar1 = hash_stream(in_stack_0003fff8,in_stack_0003fff4,in_stack_0003ffe8);
    if (iVar1 == 0) {
      perror(in_RSI);
      close(__fd);
      local_4 = 0;
    }
    else {
      close(__fd);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int hash_file(gost_hash_ctx * ctx, char *filename, char *sum, int mode)
{
    int fd;
    if ((fd = open(filename, mode)) < 0) {
        perror(filename);
        return 0;
    }
    if (!hash_stream(ctx, fd, sum)) {
        perror(filename);
        close(fd);
        return 0;
    }
    close(fd);
    return 1;
}